

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::SetCommentInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,SetCommentInfo *this)

{
  CatalogType type;
  string local_30;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ParseInfo::TypeToString_abi_cxx11_
            (&local_30,(ParseInfo *)(ulong)(byte)(this->super_AlterInfo).field_0x71,type);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ParseInfo::QualifierToString
            (&local_30,&(this->super_AlterInfo).catalog,&(this->super_AlterInfo).schema,
             &(this->super_AlterInfo).name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  Value::ToSQLString_abi_cxx11_(&local_30,&this->comment_value);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string SetCommentInfo::ToString() const {
	string result = "";

	result += "COMMENT ON ";
	result += ParseInfo::TypeToString(entry_catalog_type);
	result += " ";
	result += QualifierToString(catalog, schema, name);
	result += " IS ";
	result += comment_value.ToSQLString();

	result += ";";
	return result;
}